

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_x25519_asn1.cc
# Opt level: O2

int x25519_set_pub_raw(EVP_PKEY *pkey,uint8_t *in,size_t len)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  int iVar5;
  
  if (len == 0x20) {
    puVar4 = (undefined8 *)OPENSSL_malloc(0x41);
    if (puVar4 == (undefined8 *)0x0) {
      iVar5 = 0;
    }
    else {
      uVar1 = *(undefined8 *)in;
      uVar2 = *(undefined8 *)(in + 8);
      uVar3 = *(undefined8 *)(in + 0x18);
      puVar4[2] = *(undefined8 *)(in + 0x10);
      puVar4[3] = uVar3;
      *puVar4 = uVar1;
      puVar4[1] = uVar2;
      *(undefined1 *)(puVar4 + 8) = 0;
      x25519_free(pkey);
      pkey->pkey = puVar4;
      iVar5 = 1;
    }
  }
  else {
    iVar5 = 0;
    ERR_put_error(6,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_x25519_asn1.cc"
                  ,0x36);
  }
  return iVar5;
}

Assistant:

static int x25519_set_pub_raw(EVP_PKEY *pkey, const uint8_t *in, size_t len) {
  if (len != 32) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  X25519_KEY *key =
      reinterpret_cast<X25519_KEY *>(OPENSSL_malloc(sizeof(X25519_KEY)));
  if (key == NULL) {
    return 0;
  }

  OPENSSL_memcpy(key->pub, in, 32);
  key->has_private = 0;

  x25519_free(pkey);
  pkey->pkey = key;
  return 1;
}